

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
MergeNewHeapBlock(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                  *this,SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock
                 )

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectSize
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  if (uVar3 != (this->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x646,"(heapBlock->GetObjectSize() == this->sizeCat)",
                       "heapBlock->GetObjectSize() == this->sizeCat");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock
            (&heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,
             &this->heapBlockList->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>);
  this->heapBlockList = heapBlock;
  InterlockedDecrement<unsigned_int>(&(this->super_HeapBucket).newHeapBlockCount);
  (this->super_HeapBucket).heapBlockCount = (this->super_HeapBucket).heapBlockCount + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::MergeNewHeapBlock(TBlockType * heapBlock)
{
    Assert(heapBlock->GetObjectSize() == this->sizeCat);
    heapBlock->SetNextBlock(this->heapBlockList);
    this->heapBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    ::InterlockedDecrement(&this->newHeapBlockCount);
    this->heapBlockCount++;
#endif
}